

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_52c65e::sessionT11Fixture::createSession
          (sessionT11Fixture *this,int heartBtInt,int startDay,int endDay)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *beginString;
  string *targetCompID;
  Session *pSVar2;
  string local_738;
  string local_718;
  undefined1 local_6f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e8;
  char local_6d8 [16];
  _Alloc_hider local_6c8;
  size_type local_6c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8;
  field_metrics local_6a8;
  undefined1 local_6a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_690;
  char local_680 [16];
  _Alloc_hider local_670;
  size_type local_668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_660;
  field_metrics local_650;
  ulong local_648;
  string local_640;
  TimeRange sessionTime;
  long local_618;
  long local_610 [6];
  sessionT11Fixture *local_5e0;
  undefined8 local_5d8;
  code *local_5d0;
  code *local_5c8;
  SessionID sessionID;
  DataDictionaryProvider provider;
  
  if (this->object != (Session *)0x0) {
    (**(code **)(*(long *)this->object + 8))();
  }
  _sessionTime = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sessionTime,"FIXT.1.1","");
  beginString = (string *)
                &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
  provider.m_transportDictionaries._M_t._M_impl._0_8_ = &PTR__FieldBase_00320f80;
  provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 8;
  provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  std::__cxx11::string::_M_construct<char*>
            ((string *)beginString,_sessionTime,local_618 + (long)_sessionTime);
  provider.m_applicationDictionaries._M_t._M_impl._0_8_ =
       &provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
       0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  provider.m_transportDictionaries._M_t._M_impl._0_8_ = &PTR__FieldBase_00325970;
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"TW","");
  local_6f8._0_8_ = &PTR__FieldBase_00320f80;
  local_6f8._8_4_ = 0x31;
  local_6e8._M_allocated_capacity = (size_type)local_6d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_6f8 + 0x10),local_718._M_dataplus._M_p,
             local_718._M_dataplus._M_p + local_718._M_string_length);
  local_6c8._M_p = (pointer)&local_6b8;
  local_6c0 = 0;
  local_6b8._M_local_buf[0] = '\0';
  local_6a8.m_length = 0;
  local_6a8.m_checksum = 0;
  local_6f8._0_8_ = &PTR__FieldBase_00325010;
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"ISLD","");
  targetCompID = (string *)(local_6a0 + 0x10);
  local_6a0._0_8_ = &PTR__FieldBase_00320f80;
  local_6a0._8_4_ = 0x38;
  local_690._M_allocated_capacity = (size_type)local_680;
  local_648 = (ulong)(uint)heartBtInt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)targetCompID,local_738._M_dataplus._M_p,
             local_738._M_dataplus._M_p + local_738._M_string_length);
  local_670._M_p = (pointer)&local_660;
  local_668 = 0;
  local_660._M_local_buf[0] = '\0';
  local_650.m_length = 0;
  local_650.m_checksum = 0;
  local_6a0._0_8_ = &PTR__FieldBase_00325400;
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"");
  FIX::SessionID::SessionID
            (&sessionID,beginString,(string *)(local_6f8 + 0x10),targetCompID,&local_640);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_6a0);
  paVar1 = &local_718.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_6f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != paVar1) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&provider);
  if (_sessionTime != local_610) {
    operator_delete(_sessionTime,local_610[0] + 1);
  }
  FIX::TimeRange::TimeRange
            (&sessionTime,&(this->super_TestCallback).startTime,&(this->super_TestCallback).endTime,
             startDay,endDay);
  FIX::DataDictionaryProvider::DataDictionaryProvider(&provider);
  local_6a0._0_8_ = targetCompID;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"FIXT11","");
  FIX::TestSettings::pathForSpec((string *)local_6f8,(string *)local_6a0);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&provider,&sessionID.m_beginString,(string *)local_6f8);
  if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
    operator_delete((void *)local_6f8._0_8_,(ulong)(local_6e8._M_allocated_capacity + 1));
  }
  if ((string *)local_6a0._0_8_ != targetCompID) {
    operator_delete((void *)local_6a0._0_8_,(ulong)(local_690._M_allocated_capacity + 1));
  }
  local_6a0._0_8_ = targetCompID;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"7","");
  local_6f8._0_8_ = &PTR__FieldBase_00320f80;
  local_6f8._8_4_ = 0x468;
  local_6e8._M_allocated_capacity = (size_type)local_6d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_6f8 + 0x10),local_6a0._0_8_,
             (pointer)(local_6a0._0_8_ + CONCAT44(local_6a0._12_4_,local_6a0._8_4_)));
  local_6c0 = 0;
  local_6b8._M_local_buf[0] = '\0';
  local_6a8.m_length = 0;
  local_6a8.m_checksum = 0;
  local_6f8._0_8_ = &PTR__FieldBase_00328ff8;
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  local_6c8._M_p = (pointer)&local_6b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"FIX50","");
  FIX::TestSettings::pathForSpec(&local_718,&local_738);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            (&provider,(ApplVerID *)local_6f8,&local_718);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != paVar1) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_6f8);
  if ((string *)local_6a0._0_8_ != targetCompID) {
    operator_delete((void *)local_6a0._0_8_,(ulong)(local_690._M_allocated_capacity + 1));
  }
  local_6a0._0_8_ = targetCompID;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"4","");
  local_6f8._0_8_ = &PTR__FieldBase_00320f80;
  local_6f8._8_4_ = 0x468;
  local_6e8._M_allocated_capacity = (size_type)local_6d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_6f8 + 0x10),local_6a0._0_8_,
             (pointer)(local_6a0._0_8_ + CONCAT44(local_6a0._12_4_,local_6a0._8_4_)));
  local_6c0 = 0;
  local_6b8._M_local_buf[0] = '\0';
  local_6a8.m_length = 0;
  local_6a8.m_checksum = 0;
  local_6f8._0_8_ = &PTR__FieldBase_00328ff8;
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  local_6c8._M_p = (pointer)&local_6b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"FIX42","");
  FIX::TestSettings::pathForSpec(&local_718,&local_738);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            (&provider,(ApplVerID *)local_6f8,&local_718);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != paVar1) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_6f8);
  if ((string *)local_6a0._0_8_ != targetCompID) {
    operator_delete((void *)local_6a0._0_8_,(ulong)(local_690._M_allocated_capacity + 1));
  }
  local_6a0._0_8_ = targetCompID;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6a0,&FIX::ApplVerID_FIX40,0x2bc2fb);
  local_6f8._0_8_ = &PTR__FieldBase_00320f80;
  local_6f8._8_4_ = 0x468;
  local_6e8._M_allocated_capacity = (size_type)local_6d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_6f8 + 0x10),local_6a0._0_8_,
             (pointer)(local_6a0._0_8_ + CONCAT44(local_6a0._12_4_,local_6a0._8_4_)));
  local_6c0 = 0;
  local_6b8._M_local_buf[0] = '\0';
  local_6a8.m_length = 0;
  local_6a8.m_checksum = 0;
  local_6f8._0_8_ = &PTR__FieldBase_00328ff8;
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  local_6c8._M_p = (pointer)&local_6b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"FIX40","");
  FIX::TestSettings::pathForSpec(&local_718,&local_738);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            (&provider,(ApplVerID *)local_6f8,&local_718);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != paVar1) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_6f8);
  if ((string *)local_6a0._0_8_ != targetCompID) {
    operator_delete((void *)local_6a0._0_8_,(ulong)(local_690._M_allocated_capacity + 1));
  }
  pSVar2 = (Session *)operator_new(0x878);
  local_5d8 = 0;
  local_5c8 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SessionTestCase.cpp:546:26)>
              ::_M_invoke;
  local_5d0 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SessionTestCase.cpp:546:26)>
              ::_M_manager;
  local_5e0 = this;
  FIX::Session::Session
            (pSVar2,&local_5e0,&(this->super_TestCallback).super_NullApplication,&this->factory,
             &sessionID,&provider,&sessionTime,local_648,0);
  this->object = pSVar2;
  if (local_5d0 != (code *)0x0) {
    (*local_5d0)(&local_5e0,&local_5e0,3);
    pSVar2 = this->object;
  }
  local_718._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"FIX.5.0","");
  local_6a0._0_8_ = &PTR__FieldBase_00320f80;
  local_6a0._8_4_ = 8;
  local_690._M_allocated_capacity = (size_type)local_680;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_6a0 + 0x10),local_718._M_dataplus._M_p,
             local_718._M_dataplus._M_p + local_718._M_string_length);
  local_670._M_p = (pointer)&local_660;
  local_668 = 0;
  local_660._M_local_buf[0] = '\0';
  local_650.m_length = 0;
  local_650.m_checksum = 0;
  local_6a0._0_8_ = &PTR__FieldBase_00325970;
  FIX::Message::toApplVerID((ApplVerID *)local_6f8,(BeginString *)local_6a0);
  std::__cxx11::string::_M_assign((string *)(pSVar2 + 0x200));
  FIX::FieldBase::~FieldBase((FieldBase *)local_6f8);
  FIX::FieldBase::~FieldBase((FieldBase *)local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != paVar1) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  FIX::Session::setResponder(this->object,(Responder *)this);
  FIX::DataDictionary::~DataDictionary(&provider.emptyDataDictionary);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::~_Rb_tree(&provider.m_applicationDictionaries._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
               *)&provider);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionID.m_frozenString._M_dataplus._M_p != &sessionID.m_frozenString.field_2) {
    operator_delete(sessionID.m_frozenString._M_dataplus._M_p,
                    sessionID.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionID.m_sessionQualifier._M_dataplus._M_p != &sessionID.m_sessionQualifier.field_2) {
    operator_delete(sessionID.m_sessionQualifier._M_dataplus._M_p,
                    sessionID.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID.m_targetCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID.m_senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID);
  return;
}

Assistant:

virtual void createSession(int heartBtInt, int startDay = -1, int endDay = -1) {
    if (object) {
      delete object;
    }

    SessionID sessionID(BeginString("FIXT.1.1"), SenderCompID("TW"), TargetCompID("ISLD"));
    TimeRange sessionTime(startTime, endTime, startDay, endDay);

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary(sessionID.getBeginString(), FIX::TestSettings::pathForSpec("FIXT11"));
    provider.addApplicationDataDictionary(ApplVerID(ApplVerID_FIX50), FIX::TestSettings::pathForSpec("FIX50"));
    provider.addApplicationDataDictionary(ApplVerID(ApplVerID_FIX42), FIX::TestSettings::pathForSpec("FIX42"));
    provider.addApplicationDataDictionary(ApplVerID(ApplVerID_FIX40), FIX::TestSettings::pathForSpec("FIX40"));

    object = new Session([this]() { return now; }, *this, factory, sessionID, provider, sessionTime, heartBtInt, 0);
    object->setSenderDefaultApplVerID(FIX::Message::toApplVerID(BeginString("FIX.5.0")));
    object->setResponder(this);
  }